

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

iterator * __thiscall
google::
dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
::insert_at<std::pair<B,int>>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
          *this,size_type pos,pair<B,_int> *args)

{
  pointer ppVar1;
  long lVar2;
  long lVar3;
  length_error *this_00;
  
  lVar2 = *(long *)(this + 0x28);
  if ((ulong)(*(long *)(this + 0x30) - lVar2) < 0x1fffffffffffffff) {
    lVar3 = *(long *)(this + 0x48);
    if ((lVar2 == 0) || (*(int *)(this + 0x20) != *(int *)(lVar3 + pos * 8))) {
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
    }
    else {
      *(long *)(this + 0x28) = lVar2 + -1;
    }
    ppVar1 = (pointer)(lVar3 + pos * 8);
    (ppVar1->first)._i = 0;
    (ppVar1->first)._i = (args->first).super_A._i;
    A::move_ctor = A::move_ctor + 1;
    ppVar1->second = args->second;
    lVar2 = *(long *)(this + 0x38);
    __return_storage_ptr__->ht =
         (dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
          *)this;
    __return_storage_ptr__->pos = ppVar1;
    __return_storage_ptr__->end = (pointer)(lVar3 + lVar2 * 8);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }